

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Model::MergeFrom(Model *this,Model *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  ModelDescription *this_00;
  NonMaximumSuppression *this_01;
  ArrayFeatureExtractor *this_02;
  CategoricalMapping *this_03;
  Scaler *this_04;
  Imputer *this_05;
  FeatureVectorizer *this_06;
  OneHotEncoder *this_07;
  DictVectorizer *this_08;
  Normalizer *this_09;
  BayesianProbitRegressor *this_10;
  KNearestNeighborsClassifier *this_11;
  NeuralNetwork *this_12;
  CustomModel *this_13;
  ItemSimilarityRecommender *this_14;
  LinkedModel *this_15;
  TreeEnsembleRegressor *this_16;
  TreeEnsembleClassifier *this_17;
  Pipeline *this_18;
  NeuralNetworkRegressor *this_19;
  PipelineRegressor *this_20;
  NeuralNetworkClassifier *this_21;
  GLMRegressor *this_22;
  SupportVectorRegressor *this_23;
  PipelineClassifier *this_24;
  GLMClassifier *this_25;
  SupportVectorClassifier *this_26;
  Identity *this_27;
  Gazetteer *this_28;
  SerializedModel *this_29;
  VisionFeaturePrint *this_30;
  SoundAnalysisPreprocessing *this_31;
  TextClassifier *this_32;
  WordTagger *this_33;
  WordEmbedding *this_34;
  NonMaximumSuppression *from_00;
  ArrayFeatureExtractor *from_01;
  CategoricalMapping *from_02;
  Scaler *from_03;
  Imputer *from_04;
  FeatureVectorizer *from_05;
  OneHotEncoder *from_06;
  DictVectorizer *from_07;
  Normalizer *from_08;
  BayesianProbitRegressor *from_09;
  KNearestNeighborsClassifier *from_10;
  NeuralNetwork *from_11;
  CustomModel *from_12;
  ItemSimilarityRecommender *from_13;
  LinkedModel *from_14;
  TreeEnsembleRegressor *from_15;
  TreeEnsembleClassifier *from_16;
  NeuralNetworkRegressor *from_17;
  NeuralNetworkClassifier *from_18;
  GLMRegressor *from_19;
  SupportVectorRegressor *from_20;
  GLMClassifier *from_21;
  SupportVectorClassifier *from_22;
  Identity *from_23;
  Gazetteer *from_24;
  VisionFeaturePrint *from_25;
  SoundAnalysisPreprocessing *from_26;
  TextClassifier *from_27;
  WordTagger *from_28;
  WordEmbedding *from_29;
  ModelDescription *from_30;
  Pipeline *from_31;
  PipelineRegressor *from_32;
  PipelineClassifier *from_33;
  SerializedModel *from_34;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/Model.pb.cc"
               ,0x115b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  from_30 = from->description_;
  if (from_30 != (ModelDescription *)0x0 && from != (Model *)&_Model_default_instance_) {
    this_00 = this->description_;
    if (this_00 == (ModelDescription *)0x0) {
      this_00 = (ModelDescription *)operator_new(0x78);
      ModelDescription::ModelDescription(this_00);
      this->description_ = this_00;
      from_30 = from->description_;
    }
    if (from_30 == (ModelDescription *)0x0) {
      from_30 = (ModelDescription *)&_ModelDescription_default_instance_;
    }
    ModelDescription::MergeFrom(this_00,from_30);
  }
  if (from->specificationversion_ != 0) {
    this->specificationversion_ = from->specificationversion_;
  }
  if (from->isupdatable_ == true) {
    this->isupdatable_ = true;
  }
  uVar1 = from->_oneof_case_[0];
  if ((int)uVar1 < 600) {
    if (399 < (int)uVar1) {
      if (499 < (int)uVar1) {
        if (0x22a < (int)uVar1) {
          if (uVar1 != 0x22b) {
            if (uVar1 != 0x22c) {
              return;
            }
            if (this->_oneof_case_[0] == 0x22c) {
              this_15 = (this->Type_).linkedmodel_;
            }
            else {
              clear_Type(this);
              this->_oneof_case_[0] = 0x22c;
              this_15 = (LinkedModel *)operator_new(0x20);
              LinkedModel::LinkedModel(this_15);
              (this->Type_).linkedmodel_ = this_15;
              if (from->_oneof_case_[0] != 0x22c) {
                from_14 = LinkedModel::default_instance();
                goto LAB_001d79c7;
              }
            }
            from_14 = (from->Type_).linkedmodel_;
LAB_001d79c7:
            LinkedModel::MergeFrom(this_15,from_14);
            return;
          }
          if (this->_oneof_case_[0] == 0x22b) {
            this_13 = (this->Type_).custommodel_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 0x22b;
            this_13 = (CustomModel *)operator_new(0x48);
            CustomModel::CustomModel(this_13);
            (this->Type_).custommodel_ = this_13;
            if (from->_oneof_case_[0] != 0x22b) {
              from_12 = CustomModel::default_instance();
              goto LAB_001d799d;
            }
          }
          from_12 = (from->Type_).custommodel_;
LAB_001d799d:
          CustomModel::MergeFrom(this_13,from_12);
          return;
        }
        if (uVar1 != 500) {
          if (uVar1 != 0x1f5) {
            return;
          }
          if (this->_oneof_case_[0] == 0x1f5) {
            this_14 = (this->Type_).itemsimilarityrecommender_;
          }
          else {
            clear_Type(this);
            this->_oneof_case_[0] = 0x1f5;
            this_14 = (ItemSimilarityRecommender *)operator_new(0x70);
            ItemSimilarityRecommender::ItemSimilarityRecommender(this_14);
            (this->Type_).itemsimilarityrecommender_ = this_14;
            if (from->_oneof_case_[0] != 0x1f5) {
              from_13 = ItemSimilarityRecommender::default_instance();
              goto LAB_001d79b2;
            }
          }
          from_13 = (from->Type_).itemsimilarityrecommender_;
LAB_001d79b2:
          ItemSimilarityRecommender::MergeFrom(this_14,from_13);
          return;
        }
        if (this->_oneof_case_[0] == 500) {
          this_12 = (this->Type_).neuralnetwork_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 500;
          this_12 = (NeuralNetwork *)operator_new(0x58);
          NeuralNetwork::NeuralNetwork(this_12);
          (this->Type_).neuralnetwork_ = this_12;
          if (from->_oneof_case_[0] != 500) {
            from_11 = NeuralNetwork::default_instance();
            goto LAB_001d7988;
          }
        }
        from_11 = (from->Type_).neuralnetwork_;
LAB_001d7988:
        NeuralNetwork::MergeFrom(this_12,from_11);
        return;
      }
      switch(uVar1) {
      case 400:
        goto switchD_001d6c50_caseD_190;
      case 0x191:
        if (this->_oneof_case_[0] == 0x191) {
          this_26 = (this->Type_).supportvectorclassifier_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x191;
          this_26 = (SupportVectorClassifier *)operator_new(0xb0);
          SupportVectorClassifier::SupportVectorClassifier(this_26);
          (this->Type_).supportvectorclassifier_ = this_26;
          if (from->_oneof_case_[0] != 0x191) {
            from_22 = SupportVectorClassifier::default_instance();
            goto LAB_001d7aba;
          }
        }
        from_22 = (from->Type_).supportvectorclassifier_;
LAB_001d7aba:
        SupportVectorClassifier::MergeFrom(this_26,from_22);
        return;
      case 0x192:
        if (this->_oneof_case_[0] == 0x192) {
          this_17 = (this->Type_).treeensembleclassifier_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x192;
          this_17 = (TreeEnsembleClassifier *)operator_new(0x30);
          TreeEnsembleClassifier::TreeEnsembleClassifier(this_17);
          (this->Type_).treeensembleclassifier_ = this_17;
          if (from->_oneof_case_[0] != 0x192) {
            from_16 = TreeEnsembleClassifier::default_instance();
            goto LAB_001d79f1;
          }
        }
        from_16 = (from->Type_).treeensembleclassifier_;
LAB_001d79f1:
        TreeEnsembleClassifier::MergeFrom(this_17,from_16);
        return;
      case 0x193:
        if (this->_oneof_case_[0] == 0x193) {
          this_21 = (this->Type_).neuralnetworkclassifier_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x193;
          this_21 = (NeuralNetworkClassifier *)operator_new(0x68);
          NeuralNetworkClassifier::NeuralNetworkClassifier(this_21);
          (this->Type_).neuralnetworkclassifier_ = this_21;
          if (from->_oneof_case_[0] != 0x193) {
            from_18 = NeuralNetworkClassifier::default_instance();
            goto LAB_001d7a4d;
          }
        }
        from_18 = (from->Type_).neuralnetworkclassifier_;
LAB_001d7a4d:
        NeuralNetworkClassifier::MergeFrom(this_21,from_18);
        return;
      case 0x194:
        if (this->_oneof_case_[0] == 0x194) {
          this_11 = (this->Type_).knearestneighborsclassifier_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x194;
          this_11 = (KNearestNeighborsClassifier *)operator_new(0x48);
          KNearestNeighborsClassifier::KNearestNeighborsClassifier(this_11);
          (this->Type_).knearestneighborsclassifier_ = this_11;
          if (from->_oneof_case_[0] != 0x194) {
            from_10 = KNearestNeighborsClassifier::default_instance();
            goto LAB_001d7973;
          }
        }
        from_10 = (from->Type_).knearestneighborsclassifier_;
LAB_001d7973:
        KNearestNeighborsClassifier::MergeFrom(this_11,from_10);
        return;
      default:
        return;
      }
    }
    if (299 < (int)uVar1) {
      switch(uVar1) {
      case 300:
        goto switchD_001d6ccc_caseD_12c;
      case 0x12d:
        if (this->_oneof_case_[0] == 0x12d) {
          this_23 = (this->Type_).supportvectorregressor_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x12d;
          this_23 = (SupportVectorRegressor *)operator_new(0x38);
          SupportVectorRegressor::SupportVectorRegressor(this_23);
          (this->Type_).supportvectorregressor_ = this_23;
          if (from->_oneof_case_[0] != 0x12d) {
            from_20 = SupportVectorRegressor::default_instance();
            goto LAB_001d7a77;
          }
        }
        from_20 = (from->Type_).supportvectorregressor_;
LAB_001d7a77:
        SupportVectorRegressor::MergeFrom(this_23,from_20);
        return;
      case 0x12e:
        if (this->_oneof_case_[0] == 0x12e) {
          this_16 = (this->Type_).treeensembleregressor_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x12e;
          this_16 = (TreeEnsembleRegressor *)operator_new(0x20);
          TreeEnsembleRegressor::TreeEnsembleRegressor(this_16);
          (this->Type_).treeensembleregressor_ = this_16;
          if (from->_oneof_case_[0] != 0x12e) {
            from_15 = TreeEnsembleRegressor::default_instance();
            goto LAB_001d79dc;
          }
        }
        from_15 = (from->Type_).treeensembleregressor_;
LAB_001d79dc:
        TreeEnsembleRegressor::MergeFrom(this_16,from_15);
        return;
      case 0x12f:
        if (this->_oneof_case_[0] == 0x12f) {
          this_19 = (this->Type_).neuralnetworkregressor_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x12f;
          this_19 = (NeuralNetworkRegressor *)operator_new(0x58);
          NeuralNetworkRegressor::NeuralNetworkRegressor(this_19);
          (this->Type_).neuralnetworkregressor_ = this_19;
          if (from->_oneof_case_[0] != 0x12f) {
            from_17 = NeuralNetworkRegressor::default_instance();
            goto LAB_001d7a1f;
          }
        }
        from_17 = (from->Type_).neuralnetworkregressor_;
LAB_001d7a1f:
        NeuralNetworkRegressor::MergeFrom(this_19,from_17);
        return;
      case 0x130:
        if (this->_oneof_case_[0] == 0x130) {
          this_10 = (this->Type_).bayesianprobitregressor_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0x130;
          this_10 = (BayesianProbitRegressor *)operator_new(0x78);
          BayesianProbitRegressor::BayesianProbitRegressor(this_10);
          (this->Type_).bayesianprobitregressor_ = this_10;
          if (from->_oneof_case_[0] != 0x130) {
            from_09 = BayesianProbitRegressor::default_instance();
            goto LAB_001d795e;
          }
        }
        from_09 = (from->Type_).bayesianprobitregressor_;
LAB_001d795e:
        BayesianProbitRegressor::MergeFrom(this_10,from_09);
        return;
      default:
        return;
      }
    }
    if (uVar1 != 200) {
      if (uVar1 != 0xc9) {
        if (uVar1 != 0xca) {
          return;
        }
        if (this->_oneof_case_[0] == 0xca) {
          this_18 = (this->Type_).pipeline_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 0xca;
          this_18 = (Pipeline *)operator_new(0x48);
          Pipeline::Pipeline(this_18);
          (this->Type_).pipeline_ = this_18;
          if (from->_oneof_case_[0] != 0xca) {
            protobuf_Model_2eproto::InitDefaults();
            from_31 = (Pipeline *)&_Pipeline_default_instance_;
            goto LAB_001d7a0a;
          }
        }
        from_31 = (from->Type_).pipeline_;
LAB_001d7a0a:
        Pipeline::MergeFrom(this_18,from_31);
        return;
      }
      if (this->_oneof_case_[0] == 0xc9) {
        this_20 = (this->Type_).pipelineregressor_;
      }
      else {
        clear_Type(this);
        this->_oneof_case_[0] = 0xc9;
        this_20 = (PipelineRegressor *)operator_new(0x20);
        PipelineRegressor::PipelineRegressor(this_20);
        (this->Type_).pipelineregressor_ = this_20;
        if (from->_oneof_case_[0] != 0xc9) {
          protobuf_Model_2eproto::InitDefaults();
          from_32 = (PipelineRegressor *)&_PipelineRegressor_default_instance_;
          goto LAB_001d7a38;
        }
      }
      from_32 = (from->Type_).pipelineregressor_;
LAB_001d7a38:
      PipelineRegressor::MergeFrom(this_20,from_32);
      return;
    }
    if (this->_oneof_case_[0] == 200) {
      this_24 = (this->Type_).pipelineclassifier_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 200;
      this_24 = (PipelineClassifier *)operator_new(0x20);
      PipelineClassifier::PipelineClassifier(this_24);
      (this->Type_).pipelineclassifier_ = this_24;
      if (from->_oneof_case_[0] != 200) {
        protobuf_Model_2eproto::InitDefaults();
        from_33 = (PipelineClassifier *)&_PipelineClassifier_default_instance_;
        goto LAB_001d7a90;
      }
    }
    from_33 = (from->Type_).pipelineclassifier_;
LAB_001d7a90:
    PipelineClassifier::MergeFrom(this_24,from_33);
    return;
  }
  if (899 < (int)uVar1) {
    switch(uVar1) {
    case 2000:
      goto switchD_001d6d02_caseD_7d0;
    case 0x7d1:
      if (this->_oneof_case_[0] == 0x7d1) {
        this_33 = (this->Type_).wordtagger_;
      }
      else {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d1;
        this_33 = (WordTagger *)operator_new(0x58);
        CoreMLModels::WordTagger::WordTagger(this_33);
        (this->Type_).wordtagger_ = this_33;
        if (from->_oneof_case_[0] != 0x7d1) {
          from_28 = CoreMLModels::WordTagger::default_instance();
          goto LAB_001d7b42;
        }
      }
      from_28 = (from->Type_).wordtagger_;
LAB_001d7b42:
      CoreMLModels::WordTagger::MergeFrom(this_33,from_28);
      return;
    case 0x7d2:
      if (this->_oneof_case_[0] == 0x7d2) {
        this_30 = (this->Type_).visionfeatureprint_;
      }
      else {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d2;
        this_30 = (VisionFeaturePrint *)operator_new(0x20);
        CoreMLModels::VisionFeaturePrint::VisionFeaturePrint(this_30);
        (this->Type_).visionfeatureprint_ = this_30;
        if (from->_oneof_case_[0] != 0x7d2) {
          from_25 = CoreMLModels::VisionFeaturePrint::default_instance();
          goto LAB_001d7b0c;
        }
      }
      from_25 = (from->Type_).visionfeatureprint_;
LAB_001d7b0c:
      CoreMLModels::VisionFeaturePrint::MergeFrom(this_30,from_25);
      return;
    case 0x7d3:
      if (this->_oneof_case_[0] == 0x7d3) {
        this_31 = (this->Type_).soundanalysispreprocessing_;
      }
      else {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d3;
        this_31 = (SoundAnalysisPreprocessing *)operator_new(0x20);
        CoreMLModels::SoundAnalysisPreprocessing::SoundAnalysisPreprocessing(this_31);
        (this->Type_).soundanalysispreprocessing_ = this_31;
        if (from->_oneof_case_[0] != 0x7d3) {
          from_26 = CoreMLModels::SoundAnalysisPreprocessing::default_instance();
          goto LAB_001d7b1e;
        }
      }
      from_26 = (from->Type_).soundanalysispreprocessing_;
LAB_001d7b1e:
      CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(this_31,from_26);
      return;
    case 0x7d4:
      if (this->_oneof_case_[0] == 0x7d4) {
        this_28 = (this->Type_).gazetteer_;
      }
      else {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d4;
        this_28 = (Gazetteer *)operator_new(0x38);
        CoreMLModels::Gazetteer::Gazetteer(this_28);
        (this->Type_).gazetteer_ = this_28;
        if (from->_oneof_case_[0] != 0x7d4) {
          from_24 = CoreMLModels::Gazetteer::default_instance();
          goto LAB_001d7ae4;
        }
      }
      from_24 = (from->Type_).gazetteer_;
LAB_001d7ae4:
      CoreMLModels::Gazetteer::MergeFrom(this_28,from_24);
      return;
    case 0x7d5:
      if (this->_oneof_case_[0] == 0x7d5) {
        this_34 = (this->Type_).wordembedding_;
      }
      else {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d5;
        this_34 = (WordEmbedding *)operator_new(0x28);
        CoreMLModels::WordEmbedding::WordEmbedding(this_34);
        (this->Type_).wordembedding_ = this_34;
        if (from->_oneof_case_[0] != 0x7d5) {
          from_29 = CoreMLModels::WordEmbedding::default_instance();
          goto LAB_001d7b54;
        }
      }
      from_29 = (from->Type_).wordembedding_;
LAB_001d7b54:
      CoreMLModels::WordEmbedding::MergeFrom(this_34,from_29);
      return;
    default:
      if (uVar1 != 900) {
        if (uVar1 != 3000) {
          return;
        }
        if (this->_oneof_case_[0] == 3000) {
          this_29 = (this->Type_).serializedmodel_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 3000;
          this_29 = (SerializedModel *)operator_new(0x28);
          SerializedModel::SerializedModel(this_29);
          (this->Type_).serializedmodel_ = this_29;
          if (from->_oneof_case_[0] != 3000) {
            protobuf_Model_2eproto::InitDefaults();
            from_34 = (SerializedModel *)&_SerializedModel_default_instance_;
            goto LAB_001d7afa;
          }
        }
        from_34 = (from->Type_).serializedmodel_;
LAB_001d7afa:
        SerializedModel::MergeFrom(this_29,from_34);
        return;
      }
      if (this->_oneof_case_[0] == 900) {
        this_27 = (this->Type_).identity_;
      }
      else {
        clear_Type(this);
        this->_oneof_case_[0] = 900;
        this_27 = (Identity *)operator_new(0x18);
        Identity::Identity(this_27);
        (this->Type_).identity_ = this_27;
        if (from->_oneof_case_[0] != 900) {
          from_23 = Identity::default_instance();
          goto LAB_001d7acf;
        }
      }
      from_23 = (from->Type_).identity_;
LAB_001d7acf:
      Identity::MergeFrom(this_27,from_23);
      return;
    }
  }
  switch(uVar1) {
  case 600:
    goto switchD_001d6c8c_caseD_258;
  case 0x259:
    if (this->_oneof_case_[0] == 0x259) {
      this_05 = (this->Type_).imputer_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 0x259;
      this_05 = (Imputer *)operator_new(0x30);
      Imputer::Imputer(this_05);
      (this->Type_).imputer_ = this_05;
      if (from->_oneof_case_[0] != 0x259) {
        from_04 = Imputer::default_instance();
        goto LAB_001d78f5;
      }
    }
    from_04 = (from->Type_).imputer_;
LAB_001d78f5:
    Imputer::MergeFrom(this_05,from_04);
    return;
  case 0x25a:
    if (this->_oneof_case_[0] == 0x25a) {
      this_06 = (this->Type_).featurevectorizer_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 0x25a;
      this_06 = (FeatureVectorizer *)operator_new(0x30);
      FeatureVectorizer::FeatureVectorizer(this_06);
      (this->Type_).featurevectorizer_ = this_06;
      if (from->_oneof_case_[0] != 0x25a) {
        from_05 = FeatureVectorizer::default_instance();
        goto LAB_001d790a;
      }
    }
    from_05 = (from->Type_).featurevectorizer_;
LAB_001d790a:
    FeatureVectorizer::MergeFrom(this_06,from_05);
    return;
  case 0x25b:
    if (this->_oneof_case_[0] == 0x25b) {
      this_08 = (this->Type_).dictvectorizer_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 0x25b;
      this_08 = (DictVectorizer *)operator_new(0x20);
      DictVectorizer::DictVectorizer(this_08);
      (this->Type_).dictvectorizer_ = this_08;
      if (from->_oneof_case_[0] != 0x25b) {
        from_07 = DictVectorizer::default_instance();
        goto LAB_001d7934;
      }
    }
    from_07 = (from->Type_).dictvectorizer_;
LAB_001d7934:
    DictVectorizer::MergeFrom(this_08,from_07);
    return;
  case 0x25c:
    if (this->_oneof_case_[0] == 0x25c) {
      this_04 = (this->Type_).scaler_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 0x25c;
      this_04 = (Scaler *)operator_new(0x40);
      Scaler::Scaler(this_04);
      (this->Type_).scaler_ = this_04;
      if (from->_oneof_case_[0] != 0x25c) {
        from_03 = Scaler::default_instance();
        goto LAB_001d78e0;
      }
    }
    from_03 = (from->Type_).scaler_;
LAB_001d78e0:
    Scaler::MergeFrom(this_04,from_03);
    return;
  default:
    return;
  case 0x25e:
    if (this->_oneof_case_[0] == 0x25e) {
      this_03 = (this->Type_).categoricalmapping_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 0x25e;
      this_03 = (CategoricalMapping *)operator_new(0x30);
      CategoricalMapping::CategoricalMapping(this_03);
      (this->Type_).categoricalmapping_ = this_03;
      if (from->_oneof_case_[0] != 0x25e) {
        from_02 = CategoricalMapping::default_instance();
        goto LAB_001d78cb;
      }
    }
    from_02 = (from->Type_).categoricalmapping_;
LAB_001d78cb:
    CategoricalMapping::MergeFrom(this_03,from_02);
    return;
  case 0x25f:
    if (this->_oneof_case_[0] == 0x25f) {
      this_09 = (this->Type_).normalizer_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 0x25f;
      this_09 = (Normalizer *)operator_new(0x18);
      Normalizer::Normalizer(this_09);
      (this->Type_).normalizer_ = this_09;
      if (from->_oneof_case_[0] != 0x25f) {
        from_08 = Normalizer::default_instance();
        goto LAB_001d7949;
      }
    }
    from_08 = (from->Type_).normalizer_;
LAB_001d7949:
    Normalizer::MergeFrom(this_09,from_08);
    return;
  case 0x261:
    if (this->_oneof_case_[0] == 0x261) {
      this_02 = (this->Type_).arrayfeatureextractor_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 0x261;
      this_02 = (ArrayFeatureExtractor *)operator_new(0x28);
      ArrayFeatureExtractor::ArrayFeatureExtractor(this_02);
      (this->Type_).arrayfeatureextractor_ = this_02;
      if (from->_oneof_case_[0] != 0x261) {
        from_01 = ArrayFeatureExtractor::default_instance();
        goto LAB_001d78b6;
      }
    }
    from_01 = (from->Type_).arrayfeatureextractor_;
LAB_001d78b6:
    ArrayFeatureExtractor::MergeFrom(this_02,from_01);
    return;
  case 0x262:
    if (this->_oneof_case_[0] == 0x262) {
      this_01 = (this->Type_).nonmaximumsuppression_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 0x262;
      this_01 = (NonMaximumSuppression *)operator_new(0x70);
      NonMaximumSuppression::NonMaximumSuppression(this_01);
      (this->Type_).nonmaximumsuppression_ = this_01;
      if (from->_oneof_case_[0] != 0x262) {
        from_00 = NonMaximumSuppression::default_instance();
        goto LAB_001d78a1;
      }
    }
    from_00 = (from->Type_).nonmaximumsuppression_;
LAB_001d78a1:
    NonMaximumSuppression::MergeFrom(this_01,from_00);
    return;
  }
switchD_001d6c50_caseD_190:
  if (this->_oneof_case_[0] == 400) {
    this_25 = (this->Type_).glmclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 400;
    this_25 = (GLMClassifier *)operator_new(0x58);
    GLMClassifier::GLMClassifier(this_25);
    (this->Type_).glmclassifier_ = this_25;
    if (from->_oneof_case_[0] != 400) {
      from_21 = GLMClassifier::default_instance();
      goto LAB_001d7aa5;
    }
  }
  from_21 = (from->Type_).glmclassifier_;
LAB_001d7aa5:
  GLMClassifier::MergeFrom(this_25,from_21);
  return;
switchD_001d6ccc_caseD_12c:
  if (this->_oneof_case_[0] == 300) {
    this_22 = (this->Type_).glmregressor_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 300;
    this_22 = (GLMRegressor *)operator_new(0x48);
    GLMRegressor::GLMRegressor(this_22);
    (this->Type_).glmregressor_ = this_22;
    if (from->_oneof_case_[0] != 300) {
      from_19 = GLMRegressor::default_instance();
      goto LAB_001d7a62;
    }
  }
  from_19 = (from->Type_).glmregressor_;
LAB_001d7a62:
  GLMRegressor::MergeFrom(this_22,from_19);
  return;
switchD_001d6d02_caseD_7d0:
  if (this->_oneof_case_[0] == 2000) {
    this_32 = (this->Type_).textclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 2000;
    this_32 = (TextClassifier *)operator_new(0x38);
    CoreMLModels::TextClassifier::TextClassifier(this_32);
    (this->Type_).textclassifier_ = this_32;
    if (from->_oneof_case_[0] != 2000) {
      from_27 = CoreMLModels::TextClassifier::default_instance();
      goto LAB_001d7b30;
    }
  }
  from_27 = (from->Type_).textclassifier_;
LAB_001d7b30:
  CoreMLModels::TextClassifier::MergeFrom(this_32,from_27);
  return;
switchD_001d6c8c_caseD_258:
  if (this->_oneof_case_[0] == 600) {
    this_07 = (this->Type_).onehotencoder_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 600;
    this_07 = (OneHotEncoder *)operator_new(0x28);
    OneHotEncoder::OneHotEncoder(this_07);
    (this->Type_).onehotencoder_ = this_07;
    if (from->_oneof_case_[0] != 600) {
      from_06 = OneHotEncoder::default_instance();
      goto LAB_001d791f;
    }
  }
  from_06 = (from->Type_).onehotencoder_;
LAB_001d791f:
  OneHotEncoder::MergeFrom(this_07,from_06);
  return;
}

Assistant:

void Model::MergeFrom(const Model& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Model)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_description()) {
    mutable_description()->::CoreML::Specification::ModelDescription::MergeFrom(from.description());
  }
  if (from.specificationversion() != 0) {
    set_specificationversion(from.specificationversion());
  }
  if (from.isupdatable() != 0) {
    set_isupdatable(from.isupdatable());
  }
  switch (from.Type_case()) {
    case kPipelineClassifier: {
      mutable_pipelineclassifier()->::CoreML::Specification::PipelineClassifier::MergeFrom(from.pipelineclassifier());
      break;
    }
    case kPipelineRegressor: {
      mutable_pipelineregressor()->::CoreML::Specification::PipelineRegressor::MergeFrom(from.pipelineregressor());
      break;
    }
    case kPipeline: {
      mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from.pipeline());
      break;
    }
    case kGlmRegressor: {
      mutable_glmregressor()->::CoreML::Specification::GLMRegressor::MergeFrom(from.glmregressor());
      break;
    }
    case kSupportVectorRegressor: {
      mutable_supportvectorregressor()->::CoreML::Specification::SupportVectorRegressor::MergeFrom(from.supportvectorregressor());
      break;
    }
    case kTreeEnsembleRegressor: {
      mutable_treeensembleregressor()->::CoreML::Specification::TreeEnsembleRegressor::MergeFrom(from.treeensembleregressor());
      break;
    }
    case kNeuralNetworkRegressor: {
      mutable_neuralnetworkregressor()->::CoreML::Specification::NeuralNetworkRegressor::MergeFrom(from.neuralnetworkregressor());
      break;
    }
    case kBayesianProbitRegressor: {
      mutable_bayesianprobitregressor()->::CoreML::Specification::BayesianProbitRegressor::MergeFrom(from.bayesianprobitregressor());
      break;
    }
    case kGlmClassifier: {
      mutable_glmclassifier()->::CoreML::Specification::GLMClassifier::MergeFrom(from.glmclassifier());
      break;
    }
    case kSupportVectorClassifier: {
      mutable_supportvectorclassifier()->::CoreML::Specification::SupportVectorClassifier::MergeFrom(from.supportvectorclassifier());
      break;
    }
    case kTreeEnsembleClassifier: {
      mutable_treeensembleclassifier()->::CoreML::Specification::TreeEnsembleClassifier::MergeFrom(from.treeensembleclassifier());
      break;
    }
    case kNeuralNetworkClassifier: {
      mutable_neuralnetworkclassifier()->::CoreML::Specification::NeuralNetworkClassifier::MergeFrom(from.neuralnetworkclassifier());
      break;
    }
    case kKNearestNeighborsClassifier: {
      mutable_knearestneighborsclassifier()->::CoreML::Specification::KNearestNeighborsClassifier::MergeFrom(from.knearestneighborsclassifier());
      break;
    }
    case kNeuralNetwork: {
      mutable_neuralnetwork()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.neuralnetwork());
      break;
    }
    case kItemSimilarityRecommender: {
      mutable_itemsimilarityrecommender()->::CoreML::Specification::ItemSimilarityRecommender::MergeFrom(from.itemsimilarityrecommender());
      break;
    }
    case kCustomModel: {
      mutable_custommodel()->::CoreML::Specification::CustomModel::MergeFrom(from.custommodel());
      break;
    }
    case kLinkedModel: {
      mutable_linkedmodel()->::CoreML::Specification::LinkedModel::MergeFrom(from.linkedmodel());
      break;
    }
    case kOneHotEncoder: {
      mutable_onehotencoder()->::CoreML::Specification::OneHotEncoder::MergeFrom(from.onehotencoder());
      break;
    }
    case kImputer: {
      mutable_imputer()->::CoreML::Specification::Imputer::MergeFrom(from.imputer());
      break;
    }
    case kFeatureVectorizer: {
      mutable_featurevectorizer()->::CoreML::Specification::FeatureVectorizer::MergeFrom(from.featurevectorizer());
      break;
    }
    case kDictVectorizer: {
      mutable_dictvectorizer()->::CoreML::Specification::DictVectorizer::MergeFrom(from.dictvectorizer());
      break;
    }
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::Scaler::MergeFrom(from.scaler());
      break;
    }
    case kCategoricalMapping: {
      mutable_categoricalmapping()->::CoreML::Specification::CategoricalMapping::MergeFrom(from.categoricalmapping());
      break;
    }
    case kNormalizer: {
      mutable_normalizer()->::CoreML::Specification::Normalizer::MergeFrom(from.normalizer());
      break;
    }
    case kArrayFeatureExtractor: {
      mutable_arrayfeatureextractor()->::CoreML::Specification::ArrayFeatureExtractor::MergeFrom(from.arrayfeatureextractor());
      break;
    }
    case kNonMaximumSuppression: {
      mutable_nonmaximumsuppression()->::CoreML::Specification::NonMaximumSuppression::MergeFrom(from.nonmaximumsuppression());
      break;
    }
    case kIdentity: {
      mutable_identity()->::CoreML::Specification::Identity::MergeFrom(from.identity());
      break;
    }
    case kTextClassifier: {
      mutable_textclassifier()->::CoreML::Specification::CoreMLModels::TextClassifier::MergeFrom(from.textclassifier());
      break;
    }
    case kWordTagger: {
      mutable_wordtagger()->::CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(from.wordtagger());
      break;
    }
    case kVisionFeaturePrint: {
      mutable_visionfeatureprint()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint::MergeFrom(from.visionfeatureprint());
      break;
    }
    case kSoundAnalysisPreprocessing: {
      mutable_soundanalysispreprocessing()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(from.soundanalysispreprocessing());
      break;
    }
    case kGazetteer: {
      mutable_gazetteer()->::CoreML::Specification::CoreMLModels::Gazetteer::MergeFrom(from.gazetteer());
      break;
    }
    case kWordEmbedding: {
      mutable_wordembedding()->::CoreML::Specification::CoreMLModels::WordEmbedding::MergeFrom(from.wordembedding());
      break;
    }
    case kSerializedModel: {
      mutable_serializedmodel()->::CoreML::Specification::SerializedModel::MergeFrom(from.serializedmodel());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}